

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_collectgarbage(lua_State *L)

{
  undefined8 uVar1;
  int what;
  int32_t data;
  int iVar2;
  
  what = lj_lib_checkopt(L,1,2,anon_var_dwarf_8793e);
  data = lj_lib_optint(L,2,0);
  if (what == 3) {
    uVar1 = *(undefined8 *)((L->glref).ptr64 + 0x10);
    L->top->n = (((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) +
                ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25))
                * 0.0009765625;
  }
  else {
    iVar2 = lua_gc(L,what,data);
    if ((what == 9) || (what == 5)) {
      L->top->u64 = ~((ulong)(iVar2 + 1) << 0x2f);
    }
    else {
      L->top->n = (double)iVar2;
    }
  }
  L->top = L->top + 1;
  return 1;
}

Assistant:

LJLIB_CF(collectgarbage)
{
  int opt = lj_lib_checkopt(L, 1, LUA_GCCOLLECT,  /* ORDER LUA_GC* */
    "\4stop\7restart\7collect\5count\1\377\4step\10setpause\12setstepmul\1\377\11isrunning");
  int32_t data = lj_lib_optint(L, 2, 0);
  if (opt == LUA_GCCOUNT) {
    setnumV(L->top, (lua_Number)G(L)->gc.total/1024.0);
  } else {
    int res = lua_gc(L, opt, data);
    if (opt == LUA_GCSTEP || opt == LUA_GCISRUNNING)
      setboolV(L->top, res);
    else
      setintV(L->top, res);
  }
  L->top++;
  return 1;
}